

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data(xpath_stack_data *this)

{
  xpath_allocator *in_RDI;
  
  xpath_allocator::release(in_RDI);
  xpath_allocator::release(in_RDI);
  return;
}

Assistant:

~xpath_stack_data()
		{
			result.release();
			temp.release();
		}